

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void tcu::getCubeLinearSamples
               (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,float u,float v,
               int depth,Vec4 (*dst) [4])

{
  int size;
  float fVar1;
  float fVar2;
  int i_1;
  CubeFace CVar3;
  ulong uVar4;
  undefined1 (*pauVar5) [16];
  ulong uVar6;
  undefined4 in_register_00000014;
  undefined1 *puVar7;
  int i;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  float fVar11;
  float in_XMM0_Db;
  float in_XMM1_Db;
  CubeFaceIntCoords CVar12;
  bool hasBothCoordsOutOfBounds [4];
  Vec4 sampleColors [4];
  char acStack_dc [4];
  undefined8 local_d8;
  int local_d0;
  int iStack_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b0;
  undefined1 local_a8 [48];
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_b0 = (undefined8 *)CONCAT44(in_register_00000014,depth);
  size = (*faceAccesses)[0].m_size.m_data[0];
  local_a8._16_4_ = u + -0.5;
  local_a8._20_4_ = v + -0.5;
  local_a8._24_4_ = in_XMM0_Db + 0.0;
  local_a8._28_4_ = in_XMM1_Db + 0.0;
  local_a8._32_4_ = floorf((float)local_a8._16_4_);
  fVar11 = floorf((float)local_a8._20_4_);
  local_c8 = (int)(float)local_a8._32_4_;
  iStack_cc = (int)fVar11;
  local_d8 = CONCAT44(iStack_cc,local_c8);
  local_d0 = local_c8 + 1;
  local_c4 = iStack_cc + 1;
  local_c0 = local_c8 + 1;
  local_bc = iStack_cc + 1;
  puVar10 = (undefined8 *)local_78;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  _local_78 = (undefined1  [16])0x0;
  lVar8 = 0;
  do {
    local_a8._4_4_ = (undefined4)(&local_d8)[lVar8];
    local_a8._8_4_ = (undefined4)((ulong)(&local_d8)[lVar8] >> 0x20);
    local_a8._0_4_ = baseFace;
    CVar12 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_a8,size);
    CVar3 = CVar12.face;
    acStack_dc[lVar8] = CVar3 == CUBEFACE_LAST;
    if (CVar3 != CUBEFACE_LAST) {
      lookup((ConstPixelBufferAccess *)local_a8,(int)faceAccesses + CVar3 * 0x28,CVar12.s,CVar12.t);
      *puVar10 = CONCAT44(local_a8._4_4_,local_a8._0_4_);
      puVar10[1] = CONCAT44(local_a8._12_4_,local_a8._8_4_);
    }
    lVar8 = lVar8 + 1;
    puVar10 = puVar10 + 2;
  } while (lVar8 != 4);
  uVar6 = 0xffffffff;
  uVar4 = 0;
  do {
    if (acStack_dc[uVar4] != '\0') {
      uVar6 = uVar4 & 0xffffffff;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 4);
  if ((int)uVar6 != -1) {
    lVar8 = (long)(int)uVar6 * 0x10;
    pauVar5 = (undefined1 (*) [16])(local_78 + lVar8);
    *pauVar5 = (undefined1  [16])0x0;
    puVar7 = local_78;
    uVar4 = 0;
    do {
      if (uVar4 != uVar6) {
        lVar9 = 0;
        do {
          *(float *)(*pauVar5 + lVar9 * 4) =
               *(float *)(puVar7 + lVar9 * 4) + *(float *)(*pauVar5 + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
      }
      uVar4 = uVar4 + 1;
      puVar7 = puVar7 + 0x10;
    } while (uVar4 != 4);
    fVar11 = *(float *)(local_78 + lVar8 + 4);
    fVar1 = *(float *)(local_78 + lVar8 + 8);
    fVar2 = *(float *)(local_68 + lVar8 + -4);
    *(float *)*pauVar5 = *(float *)*pauVar5 * 0.33333334;
    *(float *)(local_78 + lVar8 + 4) = fVar11 * 0.33333334;
    *(float *)(local_78 + lVar8 + 8) = fVar1 * 0.33333334;
    *(float *)(local_68 + lVar8 + -4) = fVar2 * 0.33333334;
  }
  local_b0[6] = local_48._0_8_;
  local_b0[7] = local_48._8_8_;
  local_b0[4] = local_58._0_8_;
  local_b0[5] = local_58._8_8_;
  local_b0[2] = local_68._0_8_;
  local_b0[3] = local_68._8_8_;
  *local_b0 = local_78;
  local_b0[1] = uStack_70;
  return;
}

Assistant:

static void getCubeLinearSamples (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, float u, float v, int depth, Vec4 (&dst)[4])
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());
	int		size					= faceAccesses[0].getWidth();
	int		x0						= deFloorFloatToInt32(u-0.5f);
	int		x1						= x0+1;
	int		y0						= deFloorFloatToInt32(v-0.5f);
	int		y1						= y0+1;
	IVec2	baseSampleCoords[4]		=
	{
		IVec2(x0, y0),
		IVec2(x1, y0),
		IVec2(x0, y1),
		IVec2(x1, y1)
	};
	Vec4	sampleColors[4];
	bool	hasBothCoordsOutOfBounds[4]; //!< Whether correctCubeFace() returns CUBEFACE_LAST, i.e. both u and v are out of bounds.

	// Find correct faces and coordinates for out-of-bounds sample coordinates.

	for (int i = 0; i < 4; i++)
	{
		CubeFaceIntCoords coords = remapCubeEdgeCoords(CubeFaceIntCoords(baseFace, baseSampleCoords[i]), size);
		hasBothCoordsOutOfBounds[i] = coords.face == CUBEFACE_LAST;
		if (!hasBothCoordsOutOfBounds[i])
			sampleColors[i] = lookup(faceAccesses[coords.face], coords.s, coords.t, depth);
	}

	// If a sample was out of bounds in both u and v, we get its color from the average of the three other samples.
	// \note This averaging behavior is not required by the GLES3 spec (though it is recommended). GLES3 spec only
	//		 requires that if the three other samples all have the same color, then the doubly-out-of-bounds sample
	//		 must have this color as well.

	{
		int bothOutOfBoundsNdx = -1;
		for (int i = 0; i < 4; i++)
		{
			if (hasBothCoordsOutOfBounds[i])
			{
				DE_ASSERT(bothOutOfBoundsNdx < 0); // Only one sample can be out of bounds in both u and v.
				bothOutOfBoundsNdx = i;
			}
		}
		if (bothOutOfBoundsNdx != -1)
		{
			sampleColors[bothOutOfBoundsNdx] = Vec4(0.0f);
			for (int i = 0; i < 4; i++)
				if (i != bothOutOfBoundsNdx)
					sampleColors[bothOutOfBoundsNdx] += sampleColors[i];

			sampleColors[bothOutOfBoundsNdx] = sampleColors[bothOutOfBoundsNdx] * (1.0f/3.0f);
		}
	}

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(sampleColors); i++)
		dst[i] = sampleColors[i];
}